

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O2

void __thiscall indigox::Bond::Clear(Bond *this)

{
  value_type local_18;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>);
  local_18.super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_18.super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::fill(&this->atoms_,&local_18);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_18.super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Bond::Clear() {
    mol_.reset();
    atoms_.fill(Atom_wp());
  }